

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O3

void __thiscall
tchecker::parsing::program::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  value_type *this_00;
  value_type *pvVar1;
  symbol_kind_type sVar2;
  filename_type *pfVar3;
  counter_type cVar4;
  counter_type cVar5;
  counter_type cVar6;
  counter_type cVar7;
  shared_ptr<tchecker::statement_t> *u;
  shared_ptr<tchecker::expression_t> *u_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_01;
  shared_ptr<tchecker::var_expression_t> *u_02;
  shared_ptr<tchecker::lvalue_expression_t> *u_03;
  
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).super_by_state.state =
       s;
  *(undefined8 *)
   &(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value.field_0
   + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value.field_0
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value.field_0
   + 0x18) = 0;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value.yytypeid_ =
       (type_info *)0x0;
  pfVar3 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.begin.
           filename;
  cVar6 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.begin.
          line;
  cVar7 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.begin.
          column;
  cVar4 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.end.
          line;
  cVar5 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.end.
          column;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).location.end.
       filename;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.end.line =
       cVar4;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.end.column =
       cVar5;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.begin.filename
       = pfVar3;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.begin.line =
       cVar6;
  (this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).location.begin.column =
       cVar7;
  sVar2 = (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).super_by_kind.
          kind_;
  if ((uint)(sVar2 + ~S_TOK_LOCAL) < 0x17) {
    this_00 = &(this->super_basic_symbol<tchecker::parsing::program::parser_t::by_state>).value;
    switch(sVar2) {
    case S_TOK_ID:
    case S_TOK_INTEGER:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value;
      u_01 = value_type::as<std::__cxx11::string>(pvVar1);
      value_type::emplace<std::__cxx11::string,std::__cxx11::string>(this_00,u_01);
      value_type::destroy<std::__cxx11::string>(pvVar1);
      break;
    case S_UMINUS:
    case S_YYACCEPT:
    case S_program:
    case S_opt_semicolon:
      break;
    default:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value;
      u = value_type::as<std::shared_ptr<tchecker::statement_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::statement_t>,std::shared_ptr<tchecker::statement_t>>
                (this_00,u);
      value_type::destroy<std::shared_ptr<tchecker::statement_t>>(pvVar1);
      break;
    case S_conjunctive_formula:
    case S_non_atomic_conjunctive_formula:
    case S_atomic_formula:
    case S_predicate_formula:
    case S_binary_formula:
    case S_term:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value;
      u_00 = value_type::as<std::shared_ptr<tchecker::expression_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::expression_t>,std::shared_ptr<tchecker::expression_t>>
                (this_00,u_00);
      value_type::destroy<std::shared_ptr<tchecker::expression_t>>(pvVar1);
      break;
    case S_predicate_operator:
      value_type::move<tchecker::binary_operator_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).
                          value);
      break;
    case S_lvalue_term:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value;
      u_03 = value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::lvalue_expression_t>,std::shared_ptr<tchecker::lvalue_expression_t>>
                (this_00,u_03);
      value_type::destroy<std::shared_ptr<tchecker::lvalue_expression_t>>(pvVar1);
      break;
    case S_variable_term:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).value;
      u_02 = value_type::as<std::shared_ptr<tchecker::var_expression_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::var_expression_t>,std::shared_ptr<tchecker::var_expression_t>>
                (this_00,u_02);
      value_type::destroy<std::shared_ptr<tchecker::var_expression_t>>(pvVar1);
      break;
    case S_integer:
      value_type::move<int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).
                          value);
    }
  }
  (that->super_basic_symbol<tchecker::parsing::program::parser_t::by_kind>).super_by_kind.kind_ =
       S_YYEMPTY;
  return;
}

Assistant:

parser_t::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_predicate_operator: // predicate_operator
        value.move< enum tchecker::binary_operator_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_conjunctive_formula: // conjunctive_formula
      case symbol_kind::S_non_atomic_conjunctive_formula: // non_atomic_conjunctive_formula
      case symbol_kind::S_atomic_formula: // atomic_formula
      case symbol_kind::S_predicate_formula: // predicate_formula
      case symbol_kind::S_binary_formula: // binary_formula
      case symbol_kind::S_term: // term
        value.move< std::shared_ptr<tchecker::expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_lvalue_term: // lvalue_term
        value.move< std::shared_ptr<tchecker::lvalue_expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sequence_statement: // sequence_statement
      case symbol_kind::S_statement: // statement
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_loop_statement: // loop_statement
      case symbol_kind::S_local_statement: // local_statement
      case symbol_kind::S_simple_statement: // simple_statement
      case symbol_kind::S_assignment: // assignment
        value.move< std::shared_ptr<tchecker::statement_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_variable_term: // variable_term
        value.move< std::shared_ptr<tchecker::var_expression_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer"
        value.move< std::string > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_integer: // integer
        value.move< tchecker::integer_t > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }